

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case0205(ParserTester *this)

{
  ParseOptions parseOpts;
  ParseOptions local_130;
  Expectation local_110;
  allocator<char> local_41;
  string local_40;
  code *local_20;
  offset_in_DeclarationBinderTester_to_subr x;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_20 = DeclarationBinderTester::case0008;
  x = 0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"void x ( ) ( ) { }",&local_41);
  Expectation::Expectation(&local_110);
  ParseOptions::ParseOptions(&local_130);
  parseOpts.langExts_.translations_.field_0 = local_130.langExts_.translations_.field_0;
  parseOpts.langDialect_.std_ = local_130.langDialect_.std_;
  parseOpts._1_7_ = local_130._1_7_;
  parseOpts.langExts_.field_1.BF_all_ = local_130.langExts_.field_1.BF_all_;
  parseOpts.field_2 = local_130.field_2;
  parseOpts._26_6_ = local_130._26_6_;
  parse(this,&local_40,&local_110,Any,parseOpts);
  Expectation::~Expectation(&local_110);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void ParserTester::case0205()
{
    // Not a syntactic error, but a semantic one; covered in:
    CROSS_REFERENCE_TEST(DeclarationBinderTester::case0008) ;

    parse("void x ( ) ( ) { }") ;
}